

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

void stbi__vertical_flip(void *image,int w,int h,int bytes_per_pixel)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  size_t __n;
  void *__dest;
  void *__src;
  ulong uVar4;
  stbi_uc temp [2048];
  undefined1 local_838 [2056];
  
  uVar2 = (long)bytes_per_pixel * (long)w;
  uVar3 = 0;
  uVar1 = (ulong)(uint)(h >> 1);
  if (h >> 1 < 1) {
    uVar1 = uVar3;
  }
  for (; uVar3 != uVar1; uVar3 = uVar3 + 1) {
    __dest = (void *)(uVar2 * uVar3 + (long)image);
    __src = (void *)((long)(int)(~(uint)uVar3 + h) * uVar2 + (long)image);
    for (uVar4 = uVar2; uVar4 != 0; uVar4 = uVar4 - __n) {
      __n = 0x800;
      if (uVar4 < 0x800) {
        __n = uVar4;
      }
      __memcpy_chk(local_838,__dest,__n,0x800);
      memcpy(__dest,__src,__n);
      memcpy(__src,local_838,__n);
      __dest = (void *)((long)__dest + __n);
      __src = (void *)((long)__src + __n);
    }
  }
  return;
}

Assistant:

static void stbi__vertical_flip(void *image, int w, int h, int bytes_per_pixel)
{
   int row;
   size_t bytes_per_row = (size_t)w * bytes_per_pixel;
   stbi_uc temp[2048];
   stbi_uc *bytes = (stbi_uc *)image;

   for (row = 0; row < (h>>1); row++) {
      stbi_uc *row0 = bytes + row*bytes_per_row;
      stbi_uc *row1 = bytes + (h - row - 1)*bytes_per_row;
      // swap row0 with row1
      size_t bytes_left = bytes_per_row;
      while (bytes_left) {
         size_t bytes_copy = (bytes_left < sizeof(temp)) ? bytes_left : sizeof(temp);
         memcpy(temp, row0, bytes_copy);
         memcpy(row0, row1, bytes_copy);
         memcpy(row1, temp, bytes_copy);
         row0 += bytes_copy;
         row1 += bytes_copy;
         bytes_left -= bytes_copy;
      }
   }
}